

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qwidgetanimator_p.cpp
# Opt level: O0

void QWidgetAnimator::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int in_EDX;
  int in_ESI;
  QWidgetAnimator *in_RDI;
  QWidgetAnimator *_t;
  
  if ((in_ESI == 0) && (in_EDX == 0)) {
    animationFinished(in_RDI);
  }
  return;
}

Assistant:

void QWidgetAnimator::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QWidgetAnimator *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->animationFinished(); break;
        default: ;
        }
    }
    (void)_a;
}